

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

input_options * parse_source(input_options *__return_storage_ptr__,vw *all,options_i *options)

{
  string *location;
  bool *location_00;
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  option_group_definition *poVar6;
  options_boost_po *this;
  vw_exception *this_00;
  byte bVar7;
  ulong uVar8;
  vw_ostream *pvVar9;
  option_group_definition input_options;
  string data;
  undefined1 *local_e30 [2];
  undefined1 local_e20 [16];
  undefined1 *local_e10 [2];
  undefined1 local_e00 [16];
  string local_df0;
  undefined1 *local_dd0 [2];
  undefined1 local_dc0 [16];
  string local_db0;
  undefined1 *local_d90 [2];
  undefined1 local_d80 [16];
  string local_d70;
  undefined1 *local_d50 [2];
  undefined1 local_d40 [16];
  string local_d30;
  undefined1 *local_d10 [2];
  undefined1 local_d00 [16];
  undefined1 *local_cf0 [2];
  undefined1 local_ce0 [16];
  string local_cd0;
  undefined1 *local_cb0 [2];
  undefined1 local_ca0 [16];
  string local_c90;
  undefined1 *local_c70 [2];
  undefined1 local_c60 [16];
  string local_c50;
  undefined1 *local_c30 [2];
  undefined1 local_c20 [16];
  string local_c10;
  undefined1 *local_bf0 [2];
  undefined1 local_be0 [16];
  string local_bd0;
  undefined1 *local_bb0 [2];
  undefined1 local_ba0 [16];
  string local_b90;
  undefined1 *local_b70 [2];
  undefined1 local_b60 [16];
  string local_b50;
  undefined1 *local_b30 [2];
  undefined1 local_b20 [16];
  undefined1 *local_b10 [2];
  undefined1 local_b00 [16];
  string local_af0;
  undefined1 *local_ad0;
  long local_ac8;
  undefined1 local_ac0 [16];
  option_group_definition local_ab0;
  undefined1 *local_a78 [2];
  undefined1 local_a68 [16];
  string local_a58;
  undefined1 *local_a38 [2];
  undefined1 local_a28 [16];
  string local_a18;
  undefined1 local_9f8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_970;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_960;
  undefined1 local_958 [16];
  undefined1 local_948 [64];
  string local_908 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8c0;
  string local_7d0;
  undefined1 local_7b0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_728;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_718;
  undefined1 local_710 [80];
  string local_6c0 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_688;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_678;
  undefined1 local_670 [80];
  string local_620 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5d8;
  undefined1 local_5d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_538;
  undefined1 local_530 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_498;
  undefined1 local_490 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  undefined1 local_3f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  undefined1 local_350 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  undefined1 local_2b0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_210 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined1 local_170 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  (__return_storage_ptr__->pid_file)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pid_file).field_2;
  (__return_storage_ptr__->pid_file)._M_string_length = 0;
  (__return_storage_ptr__->pid_file).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->port_file)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->port_file).field_2;
  (__return_storage_ptr__->port_file)._M_string_length = 0;
  (__return_storage_ptr__->port_file).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ad0 = local_ac0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"Input options","");
  local_ab0.m_name._M_dataplus._M_p = (pointer)&local_ab0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_ab0,local_ad0,local_ad0 + local_ac8);
  local_ab0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ab0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ab0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_ad0 != local_ac0) {
    operator_delete(local_ad0);
  }
  local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_af0,"data","");
  location = &all->data_filename;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_958,&local_af0,location);
  local_b10[0] = local_b00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b10,"d","");
  std::__cxx11::string::_M_assign(local_908);
  local_b30[0] = local_b20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b30,"Example set","");
  std::__cxx11::string::_M_assign((string *)(local_948 + 0x20));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (&local_ab0,
                      (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_958);
  local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b50,"daemon","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_9f8,&local_b50,&__return_storage_ptr__->daemon);
  local_b70[0] = local_b60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b70,"persistent daemon mode on port 26542","");
  std::__cxx11::string::_M_assign((string *)(local_9f8 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar6,(typed_option<bool> *)local_9f8);
  local_b90._M_dataplus._M_p = (pointer)&local_b90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b90,"foreground","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_7b0,&local_b90,&__return_storage_ptr__->foreground);
  local_bb0[0] = local_ba0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bb0,"in persistent daemon mode, do not run in the background","");
  std::__cxx11::string::_M_assign((string *)(local_7b0 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar6,(typed_option<bool> *)local_7b0);
  local_bd0._M_dataplus._M_p = (pointer)&local_bd0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bd0,"port","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_d0,&local_bd0,&__return_storage_ptr__->port);
  local_bf0[0] = local_be0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bf0,"port to listen on; use 0 to pick unused port","");
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar6,(typed_option<unsigned_long> *)local_d0);
  local_c10._M_dataplus._M_p = (pointer)&local_c10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c10,"num_children","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_170,&local_c10,&all->num_children);
  local_c30[0] = local_c20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c30,"number of children for persistent daemon mode","");
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar6,(typed_option<unsigned_long> *)local_170);
  local_c50._M_dataplus._M_p = (pointer)&local_c50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c50,"pid_file","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_210,&local_c50,&__return_storage_ptr__->pid_file);
  local_c70[0] = local_c60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c70,"Write pid file in persistent daemon mode","");
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar6,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_210);
  local_c90._M_dataplus._M_p = (pointer)&local_c90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c90,"port_file","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_2b0,&local_c90,&__return_storage_ptr__->port_file);
  local_cb0[0] = local_ca0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cb0,"Write port used in persistent daemon mode","");
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar6,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_2b0);
  local_cd0._M_dataplus._M_p = (pointer)&local_cd0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cd0,"cache","");
  location_00 = &__return_storage_ptr__->cache;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_670,&local_cd0,location_00);
  local_cf0[0] = local_ce0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cf0,"c","");
  std::__cxx11::string::_M_assign(local_620);
  local_d10[0] = local_d00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d10,"Use a cache.  The default is <data>.cache","");
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar6,(typed_option<bool> *)local_670);
  local_d30._M_dataplus._M_p = (pointer)&local_d30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d30,"cache_file","");
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_350,&local_d30,&__return_storage_ptr__->cache_files);
  local_d50[0] = local_d40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d50,"The location(s) of cache_file.","");
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar6 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (poVar6,(typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_350);
  local_d70._M_dataplus._M_p = (pointer)&local_d70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d70,"json","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3f0,&local_d70,&__return_storage_ptr__->json);
  local_d90[0] = local_d80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d90,"Enable JSON parsing.","");
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar6,(typed_option<bool> *)local_3f0);
  local_db0._M_dataplus._M_p = (pointer)&local_db0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_db0,"dsjson","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_490,&local_db0,&__return_storage_ptr__->dsjson);
  local_dd0[0] = local_dc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_dd0,"Enable Decision Service JSON parsing.","");
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar6,(typed_option<bool> *)local_490);
  local_df0._M_dataplus._M_p = (pointer)&local_df0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_df0,"kill_cache","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_710,&local_df0,&__return_storage_ptr__->kill_cache);
  local_e10[0] = local_e00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e10,"k","");
  std::__cxx11::string::_M_assign(local_6c0);
  local_e30[0] = local_e20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e30,"do not reuse existing cache: create a new one always","");
  std::__cxx11::string::_M_assign((string *)(local_710 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar6,(typed_option<bool> *)local_710);
  local_a18._M_dataplus._M_p = (pointer)&local_a18.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a18,"compressed","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_530,&local_a18,&__return_storage_ptr__->compressed);
  local_a38[0] = local_a28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a38,
             "use gzip format whenever possible. If a cache file is being created, this option creates a compressed cache file. A mixture of raw-text & compressed inputs are supported with autodetection."
             ,"");
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  poVar6 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar6,(typed_option<bool> *)local_530);
  local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a58,"no_stdin","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_5d0,&local_a58,&all->stdin_off);
  local_a78[0] = local_a68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a78,"do not default to reading from stdin","");
  std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar6,(typed_option<bool> *)local_5d0);
  if (local_a78[0] != local_a68) {
    operator_delete(local_a78[0]);
  }
  local_5d0._0_8_ = &PTR__typed_option_002da130;
  if (local_538._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_538._M_pi);
  }
  if (local_548._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_548._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p);
  }
  if (local_a38[0] != local_a28) {
    operator_delete(local_a38[0]);
  }
  local_530._0_8_ = &PTR__typed_option_002da130;
  if (local_498._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498._M_pi);
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p);
  }
  if (local_e30[0] != local_e20) {
    operator_delete(local_e30[0]);
  }
  if (local_e10[0] != local_e00) {
    operator_delete(local_e10[0]);
  }
  local_710._0_8_ = &PTR__typed_option_002da130;
  if (local_678._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_678._M_pi);
  }
  if (local_688._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_688._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_710);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df0._M_dataplus._M_p != &local_df0.field_2) {
    operator_delete(local_df0._M_dataplus._M_p);
  }
  if (local_dd0[0] != local_dc0) {
    operator_delete(local_dd0[0]);
  }
  local_490._0_8_ = &PTR__typed_option_002da130;
  if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_db0._M_dataplus._M_p != &local_db0.field_2) {
    operator_delete(local_db0._M_dataplus._M_p);
  }
  if (local_d90[0] != local_d80) {
    operator_delete(local_d90[0]);
  }
  local_3f0._0_8_ = &PTR__typed_option_002da130;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d70._M_dataplus._M_p != &local_d70.field_2) {
    operator_delete(local_d70._M_dataplus._M_p);
  }
  if (local_d50[0] != local_d40) {
    operator_delete(local_d50[0]);
  }
  local_350._0_8_ = &PTR__typed_option_002da1d0;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d30._M_dataplus._M_p != &local_d30.field_2) {
    operator_delete(local_d30._M_dataplus._M_p);
  }
  if (local_d10[0] != local_d00) {
    operator_delete(local_d10[0]);
  }
  if (local_cf0[0] != local_ce0) {
    operator_delete(local_cf0[0]);
  }
  local_670._0_8_ = &PTR__typed_option_002da130;
  if (local_5d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5d8._M_pi);
  }
  if (local_5e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_670);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd0._M_dataplus._M_p != &local_cd0.field_2) {
    operator_delete(local_cd0._M_dataplus._M_p);
  }
  if (local_cb0[0] != local_ca0) {
    operator_delete(local_cb0[0]);
  }
  local_2b0._0_8_ = &PTR__typed_option_002da198;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c90._M_dataplus._M_p != &local_c90.field_2) {
    operator_delete(local_c90._M_dataplus._M_p);
  }
  if (local_c70[0] != local_c60) {
    operator_delete(local_c70[0]);
  }
  local_210._0_8_ = &PTR__typed_option_002da198;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c50._M_dataplus._M_p != &local_c50.field_2) {
    operator_delete(local_c50._M_dataplus._M_p);
  }
  if (local_c30[0] != local_c20) {
    operator_delete(local_c30[0]);
  }
  local_170._0_8_ = &PTR__typed_option_002da208;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c10._M_dataplus._M_p != &local_c10.field_2) {
    operator_delete(local_c10._M_dataplus._M_p);
  }
  if (local_bf0[0] != local_be0) {
    operator_delete(local_bf0[0]);
  }
  local_d0._0_8_ = &PTR__typed_option_002da208;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd0._M_dataplus._M_p != &local_bd0.field_2) {
    operator_delete(local_bd0._M_dataplus._M_p);
  }
  if (local_bb0[0] != local_ba0) {
    operator_delete(local_bb0[0]);
  }
  local_7b0._0_8_ = &PTR__typed_option_002da130;
  if (local_718._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_718._M_pi);
  }
  if (local_728._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_728._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_7b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
    operator_delete(local_b90._M_dataplus._M_p);
  }
  if (local_b70[0] != local_b60) {
    operator_delete(local_b70[0]);
  }
  local_9f8._0_8_ = &PTR__typed_option_002da130;
  if (local_960._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_960._M_pi);
  }
  if (local_970._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_970._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_9f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
    operator_delete(local_b50._M_dataplus._M_p);
  }
  if (local_b30[0] != local_b20) {
    operator_delete(local_b30[0]);
  }
  if (local_b10[0] != local_b00) {
    operator_delete(local_b10[0]);
  }
  local_958._0_8_ = &PTR__typed_option_002da198;
  if (local_8c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8c0._M_pi);
  }
  if (local_8d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8d0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_958);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
    operator_delete(local_af0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_ab0);
  this = (options_boost_po *)
         __dynamic_cast(options,&VW::config::options_i::typeinfo,
                        &VW::config::options_boost_po::typeinfo,0);
  if (this != (options_boost_po *)0x0) {
    local_958._8_8_ = (string *)0x0;
    local_948[0] = '\0';
    local_9f8._0_8_ = local_9f8 + 0x10;
    local_958._0_8_ = local_948;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"data","");
    bVar3 = VW::config::options_boost_po::try_get_positional_option_token
                      (this,(string *)local_9f8,(string *)local_958,-1);
    if ((undefined1 *)local_9f8._0_8_ != local_9f8 + 0x10) {
      operator_delete((void *)local_9f8._0_8_);
    }
    if ((bVar3) &&
       ((psVar1 = (string *)(all->data_filename)._M_string_length,
        psVar1 != (string *)local_958._8_8_ ||
        ((psVar1 != (string *)0x0 &&
         (iVar5 = bcmp((location->_M_dataplus)._M_p,(void *)local_958._0_8_,(size_t)psVar1),
         iVar5 != 0)))))) {
      std::__cxx11::string::_M_assign((string *)location);
    }
    if ((undefined1 *)local_958._0_8_ != local_948) {
      operator_delete((void *)local_958._0_8_);
    }
  }
  if (__return_storage_ptr__->daemon == false) {
    local_958._0_8_ = local_948;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_958,"pid_file","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_958);
    bVar7 = 1;
    if ((char)iVar5 == '\0') {
      local_9f8._0_8_ = local_9f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"port","");
      iVar5 = (*options->_vptr_options_i[1])(options,local_9f8);
      bVar3 = all->active;
      if ((undefined1 *)local_9f8._0_8_ != local_9f8 + 0x10) {
        operator_delete((void *)local_9f8._0_8_);
      }
      bVar7 = (byte)iVar5 & (bVar3 ^ 1U);
    }
    if ((undefined1 *)local_958._0_8_ != local_948) {
      operator_delete((void *)local_958._0_8_);
    }
    if (bVar7 != 0) goto LAB_00120036;
  }
  else {
LAB_00120036:
    all->daemon = true;
    all->numpasses = 100000;
  }
  if (*location_00 == true) {
    pcVar2 = (all->data_filename)._M_dataplus._M_p;
    local_958._0_8_ = local_948;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_958,pcVar2,pcVar2 + (all->data_filename)._M_string_length);
    std::__cxx11::string::append(local_958);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->cache_files,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_958);
    if ((undefined1 *)local_958._0_8_ != local_948) {
      operator_delete((void *)local_958._0_8_);
    }
  }
  if (__return_storage_ptr__->compressed == true) {
    set_compressed(all->p);
  }
  local_958._0_8_ = local_948;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_958,".gz","");
  psVar1 = (string *)(all->data_filename)._M_string_length;
  uVar8 = (long)psVar1 - local_958._8_8_;
  if (psVar1 < (ulong)local_958._8_8_ || uVar8 == 0) {
    bVar3 = false;
  }
  else {
    iVar5 = std::__cxx11::string::compare((ulong)location,uVar8,(string *)local_958._8_8_);
    bVar3 = iVar5 == 0;
  }
  if ((undefined1 *)local_958._0_8_ != local_948) {
    operator_delete((void *)local_958._0_8_);
  }
  if (bVar3) {
    set_compressed(all->p);
  }
  bVar3 = *location_00;
  if (bVar3 == false) {
    local_9f8._0_8_ = local_9f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"cache_file","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_9f8);
    if ((char)iVar5 != '\0') goto LAB_00120181;
    cVar4 = '\0';
  }
  else {
LAB_00120181:
    local_958._0_8_ = local_948;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_958,"invert_hash","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_958);
    cVar4 = (char)iVar5;
    if ((undefined1 *)local_958._0_8_ != local_948) {
      operator_delete((void *)local_958._0_8_);
    }
    if (bVar3 != false) goto LAB_001201e4;
  }
  if ((undefined1 *)local_9f8._0_8_ != local_9f8 + 0x10) {
    operator_delete((void *)local_9f8._0_8_);
  }
LAB_001201e4:
  if (cVar4 != '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)local_958);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_948,
               "invert_hash is incompatible with a cache file.  Use it in single pass mode only.",
               0x50);
    this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
               ,0x1d8,&local_7d0);
    __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (all->holdout_set_off == false) {
    local_958._0_8_ = local_948;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_958,"output_feature_regularizer_binary","");
    iVar5 = (*options->_vptr_options_i[1])(options,local_958);
    cVar4 = '\x01';
    if ((char)iVar5 == '\0') {
      local_7b0._0_8_ = local_7b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_7b0,"output_feature_regularizer_text","");
      iVar5 = (*options->_vptr_options_i[1])(options,local_7b0);
      cVar4 = (char)iVar5;
      if ((undefined1 *)local_7b0._0_8_ != local_7b0 + 0x10) {
        operator_delete((void *)local_7b0._0_8_);
      }
    }
    if ((undefined1 *)local_958._0_8_ != local_948) {
      operator_delete((void *)local_958._0_8_);
    }
    if (cVar4 != '\0') {
      all->holdout_set_off = true;
      pvVar9 = &all->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar9->super_ostream,
                 "Making holdout_set_off=true since output regularizer specified",0x3e);
      std::ios::widen((char)(pvVar9->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar9);
      std::ostream::put((char)pvVar9);
      std::ostream::flush();
    }
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_ab0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab0.m_name._M_dataplus._M_p != &local_ab0.m_name.field_2) {
    operator_delete(local_ab0.m_name._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

input_options parse_source(vw& all, options_i& options)
{
  input_options parsed_options;

  option_group_definition input_options("Input options");
  input_options.add(make_option("data", all.data_filename).short_name("d").help("Example set"))
      .add(make_option("daemon", parsed_options.daemon).help("persistent daemon mode on port 26542"))
      .add(make_option("foreground", parsed_options.foreground)
               .help("in persistent daemon mode, do not run in the background"))
      .add(make_option("port", parsed_options.port).help("port to listen on; use 0 to pick unused port"))
      .add(make_option("num_children", all.num_children).help("number of children for persistent daemon mode"))
      .add(make_option("pid_file", parsed_options.pid_file).help("Write pid file in persistent daemon mode"))
      .add(make_option("port_file", parsed_options.port_file).help("Write port used in persistent daemon mode"))
      .add(make_option("cache", parsed_options.cache).short_name("c").help("Use a cache.  The default is <data>.cache"))
      .add(make_option("cache_file", parsed_options.cache_files).help("The location(s) of cache_file."))
      .add(make_option("json", parsed_options.json).help("Enable JSON parsing."))
      .add(make_option("dsjson", parsed_options.dsjson).help("Enable Decision Service JSON parsing."))
      .add(make_option("kill_cache", parsed_options.kill_cache)
               .short_name("k")
               .help("do not reuse existing cache: create a new one always"))
      .add(
          make_option("compressed", parsed_options.compressed)
              .help(
                  "use gzip format whenever possible. If a cache file is being created, this option creates a "
                  "compressed cache file. A mixture of raw-text & compressed inputs are supported with autodetection."))
      .add(make_option("no_stdin", all.stdin_off).help("do not default to reading from stdin"));

  options.add_and_parse(input_options);

  // If the option provider is program_options try and retrieve data as a positional parameter.
  options_i* options_ptr = &options;
  auto boost_options = dynamic_cast<options_boost_po*>(options_ptr);
  if (boost_options)
  {
    std::string data;
    if (boost_options->try_get_positional_option_token("data", data, -1))
    {
      if (all.data_filename != data)
      {
        all.data_filename = data;
      }
    }
  }

  if (parsed_options.daemon || options.was_supplied("pid_file") || (options.was_supplied("port") && !all.active))
  {
    all.daemon = true;
    // allow each child to process up to 1e5 connections
    all.numpasses = (size_t)1e5;
  }

  // Add an implicit cache file based on the data filename.
  if (parsed_options.cache)
  {
    parsed_options.cache_files.push_back(all.data_filename + ".cache");
  }

  if (parsed_options.compressed)
    set_compressed(all.p);

  if (ends_with(all.data_filename, ".gz"))
    set_compressed(all.p);

  if ((parsed_options.cache || options.was_supplied("cache_file")) && options.was_supplied("invert_hash"))
    THROW("invert_hash is incompatible with a cache file.  Use it in single pass mode only.");

  if (!all.holdout_set_off &&
      (options.was_supplied("output_feature_regularizer_binary") ||
          options.was_supplied("output_feature_regularizer_text")))
  {
    all.holdout_set_off = true;
    all.trace_message << "Making holdout_set_off=true since output regularizer specified" << endl;
  }

  return parsed_options;
}